

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::structure::structure(structure *this,structure *s)

{
  undefined8 uVar1;
  bool bVar2;
  var *pvVar3;
  domain_type *this_00;
  string *name;
  element_type *args;
  anon_union_8_1_a8a14541_for_iterator_1 this_01;
  long in_RSI;
  undefined1 *in_RDI;
  iterator iVar4;
  value_type *it_1;
  const_iterator __end2;
  const_iterator __begin2;
  element_type *__range2;
  var *v;
  value_type *it;
  const_iterator __end3;
  const_iterator __begin3;
  element_type *__range3;
  structure *parent;
  var p;
  structure *_parent;
  var *_p;
  string *in_stack_fffffffffffffcf8;
  domain_type *in_stack_fffffffffffffd00;
  var *in_stack_fffffffffffffd30;
  domain_type *val;
  string *in_stack_fffffffffffffd38;
  domain_type *in_stack_fffffffffffffd40;
  anon_union_8_1_a8a14541_for_iterator_1 local_2b0;
  string *in_stack_fffffffffffffd58;
  string *name_00;
  domain_type *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  allocator local_199;
  string local_198 [16];
  any *in_stack_fffffffffffffe78;
  any *in_stack_fffffffffffffe80;
  var *in_stack_fffffffffffffe88;
  allocator local_169;
  string local_168 [32];
  EVP_PKEY_CTX local_148 [8];
  EVP_PKEY_CTX local_140 [8];
  domain_type *local_138;
  iterator local_130;
  iterator local_120;
  element_type *local_110;
  EVP_PKEY_CTX local_108 [8];
  EVP_PKEY_CTX local_100 [8];
  var *local_f8;
  reference local_f0;
  iterator local_e8;
  iterator local_d8;
  element_type *local_c8;
  allocator local_b9;
  string local_b8 [32];
  structure *local_98;
  EVP_PKEY_CTX local_90 [8];
  EVP_PKEY_CTX local_88 [8];
  structure *local_80;
  allocator local_71;
  string local_70 [32];
  var *local_50;
  allocator local_41;
  string local_40 [48];
  long local_10;
  
  *in_RDI = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 8),(string *)(in_RSI + 8));
  std::make_shared<cs::domain_type>();
  uVar1 = *(undefined8 *)(local_10 + 0x40);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(local_10 + 0x38);
  *(undefined8 *)(in_RDI + 0x40) = uVar1;
  std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f2ceb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"parent",&local_41);
  bVar2 = domain_type::exist(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar2) {
    std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f2d7d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"parent",&local_71);
    pvVar3 = domain_type::get_var(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_50 = pvVar3;
    local_80 = cs_impl::any::val<cs::structure>
                         ((any *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    cs_impl::any::any((any *)in_stack_fffffffffffffd00,(any *)in_stack_fffffffffffffcf8);
    copy(local_88,local_90);
    cs_impl::any::~any((any *)0x1f2e63);
    local_98 = cs_impl::any::val<cs::structure>
                         ((any *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f2e9b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"parent",&local_b9);
    domain_type::add_var
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    local_c8 = std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_fffffffffffffd00);
    local_d8 = (iterator)domain_type::begin_abi_cxx11_((domain_type *)0x1f2f35);
    local_e8 = (iterator)domain_type::end_abi_cxx11_((domain_type *)0x1f2f74);
    while( true ) {
      bVar2 = phmap::priv::operator!=
                        ((const_iterator *)in_stack_fffffffffffffd00,
                         (const_iterator *)in_stack_fffffffffffffcf8);
      if (!bVar2) break;
      local_f0 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::const_iterator::operator*((const_iterator *)0x1f2fe1);
      std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f300c);
      local_f8 = domain_type::get_var(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f3047);
      pvVar3 = domain_type::get_var(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      bVar2 = cs_impl::any::is_same(pvVar3,local_f8);
      if (bVar2) {
        std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x1f3296);
        std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x1f32bc);
        domain_type::get_var_by_id(in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
        domain_type::add_var
                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      }
      else {
        std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x1f308f);
        cs_impl::any::any((any *)in_stack_fffffffffffffd00,(any *)in_stack_fffffffffffffcf8);
        copy(local_100,local_108);
        domain_type::add_var
                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        cs_impl::any::~any((any *)0x1f3101);
        cs_impl::any::~any((any *)0x1f310e);
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffd00);
    }
    cs_impl::any::~any((any *)0x1f331b);
  }
  local_110 = std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffd00);
  local_120 = (iterator)domain_type::begin_abi_cxx11_((domain_type *)0x1f3355);
  this_01 = local_120.field_1;
  iVar4 = (iterator)domain_type::end_abi_cxx11_((domain_type *)0x1f3388);
  local_130 = iVar4;
  while( true ) {
    local_2b0 = iVar4.field_1;
    name_00 = (string *)iVar4.ctrl_;
    bVar2 = phmap::priv::operator!=
                      ((const_iterator *)in_stack_fffffffffffffd00,
                       (const_iterator *)in_stack_fffffffffffffcf8);
    if (!bVar2) break;
    this_00 = (domain_type *)
              phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::const_iterator::operator*((const_iterator *)0x1f33e3);
    local_138 = this_00;
    std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f3408);
    bVar2 = domain_type::exist(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    if (!bVar2) {
      std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f3431);
      val = local_138;
      std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f3454);
      name = (string *)
             domain_type::get_var_by_id(in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8)
      ;
      cs_impl::any::any((any *)in_stack_fffffffffffffd00,(any *)in_stack_fffffffffffffcf8);
      copy(local_140,local_148);
      domain_type::add_var(this_00,name,(var *)val);
      cs_impl::any::~any((any *)0x1f34c0);
      cs_impl::any::~any((any *)0x1f34cd);
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffd00);
    iVar4.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)local_2b0.slot_;
    iVar4.ctrl_ = (ctrl_t *)name_00;
  }
  args = std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1f353f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"duplicate",&local_169);
  bVar2 = domain_type::exist(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  if (bVar2) {
    std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f35bf);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"duplicate",&local_199);
    domain_type::get_var((domain_type *)this_01.slot_,name_00);
    cs_impl::any::make<cs::structure,cs::structure*>((structure **)args);
    cs_impl::any::make<cs::structure,cs::structure_const*>((structure **)args);
    invoke<cs_impl::any,cs_impl::any>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    cs_impl::any::~any((any *)0x1f3687);
    cs_impl::any::~any((any *)0x1f3694);
    cs_impl::any::~any((any *)0x1f36a1);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  return;
}

Assistant:

structure(const structure &s) : m_id(s.m_id), m_name(s.m_name),
			m_data(std::make_shared<domain_type>())
		{
			if (s.m_data->exist("parent")) {
				var &_p = s.m_data->get_var("parent");
				auto &_parent = _p.val<structure>();
				var p = copy(_p);
				auto &parent = p.val<structure>();
				m_data->add_var("parent", p);
				for (auto &it: *parent.m_data) {
					// Handle overriding
					const var &v = s.m_data->get_var(it.first);
					if (!_parent.m_data->get_var(it.first).is_same(v))
						m_data->add_var(it.first, copy(v));
					else
						m_data->add_var(it.first, parent.m_data->get_var_by_id(it.second));
				}
			}
			for (auto &it: *s.m_data)
				if (!m_data->exist(it.first))
					m_data->add_var(it.first, copy(s.m_data->get_var_by_id(it.second)));
			if (m_data->exist("duplicate"))
				invoke(m_data->get_var("duplicate"), var::make<structure>(this), var::make<structure>(&s));
		}